

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  char *pcVar1;
  Stream *pSVar2;
  ulong uVar3;
  pointer pCVar4;
  long lVar5;
  
  Stream::Writef(this->json_stream_,"[");
  pCVar4 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar4) {
    lVar5 = 0x28;
    uVar3 = 0;
    do {
      Stream::Writef(this->json_stream_,"{");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      switch(*(undefined4 *)((long)pCVar4 + lVar5 + -8)) {
      case 0xfffffffc:
        pSVar2 = this->json_stream_;
        pcVar1 = "f64";
        break;
      case 0xfffffffd:
        pSVar2 = this->json_stream_;
        pcVar1 = "f32";
        goto LAB_00f5758f;
      case 0xfffffffe:
        pSVar2 = this->json_stream_;
        pcVar1 = "i64";
        break;
      case 0xffffffff:
        pSVar2 = this->json_stream_;
        pcVar1 = "i32";
LAB_00f5758f:
        Stream::Writef(pSVar2,"\"%s\"",pcVar1);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%u\"",
                       (ulong)*(uint *)((long)&(pCVar4->loc).filename.data_ + lVar5));
        goto LAB_00f575d8;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc"
                      ,0xcc,
                      "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteConst(const Const &)"
                     );
      }
      Stream::Writef(pSVar2,"\"%s\"",pcVar1);
      Stream::Writef(this->json_stream_,", ");
      Stream::Writef(this->json_stream_,"\"%s\": ","value");
      Stream::Writef(this->json_stream_,"\"%lu\"",
                     *(undefined8 *)((long)&(pCVar4->loc).filename.data_ + lVar5));
LAB_00f575d8:
      Stream::Writef(this->json_stream_,"}");
      if (uVar3 != ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 - 1U)
      {
        Stream::Writef(this->json_stream_,", ");
      }
      uVar3 = uVar3 + 1;
      pCVar4 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x38;
    } while (uVar3 < (ulong)(((long)(consts->
                                    super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) *
                            0x6db6db6db6db6db7));
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}